

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

string * google::protobuf::compiler::objectivec::UnCamelCaseFieldName
                   (string *__return_storage_ptr__,string *name,FieldDescriptor *field)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  Type TVar4;
  string *psVar5;
  bool bVar6;
  string worker;
  _Alloc_hider local_b0;
  string *local_a8;
  char local_a0;
  undefined7 uStack_9f;
  undefined8 uStack_98;
  long *local_90;
  string *local_88;
  long local_80 [2];
  long *local_70;
  string *local_68;
  long local_60 [2];
  long *local_50;
  string *local_48;
  long local_40 [2];
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_b0._M_p = &local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + name->_M_string_length);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"_p","");
  if (local_a8 < local_88) {
    bVar6 = false;
  }
  else {
    iVar2 = std::__cxx11::string::compare((ulong)&local_b0,(long)local_a8 - (long)local_88,local_88)
    ;
    bVar6 = iVar2 == 0;
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (bVar6) {
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"_p","");
    if ((local_a8 < local_68) ||
       (iVar2 = std::__cxx11::string::compare
                          ((ulong)&local_b0,(long)local_a8 - (long)local_68,local_68), iVar2 != 0))
    {
      local_90 = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_b0._M_p,local_a8 + (long)local_b0._M_p);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_b0);
    }
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  iVar2 = *(int *)(field + 0x4c);
  if (iVar2 == 3) {
    local_90 = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Array","");
    if (local_88 <= local_a8) {
      iVar3 = std::__cxx11::string::compare
                        ((ulong)&local_b0,(long)local_a8 - (long)local_88,local_88);
      bVar6 = iVar3 == 0;
      goto LAB_00230e7a;
    }
  }
  bVar6 = false;
LAB_00230e7a:
  if ((iVar2 == 3) && (local_90 != local_80)) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (bVar6) {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Array","");
    if ((local_a8 < local_48) ||
       (iVar2 = std::__cxx11::string::compare
                          ((ulong)&local_b0,(long)local_a8 - (long)local_48,local_48), iVar2 != 0))
    {
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_b0._M_p,local_a8 + (long)local_b0._M_p);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_b0);
    }
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_70);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  TVar4 = FieldDescriptor::type(field);
  if (TVar4 == TYPE_GROUP) {
    if ((local_a8 != (string *)0x0) && ((byte)(*local_b0._M_p + 0x9fU) < 0x1a)) {
      *local_b0._M_p = *local_b0._M_p + -0x20;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_b0._M_p == &local_a0) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_9f,local_a0);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_98;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_b0._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_9f,local_a0);
    }
    __return_storage_ptr__->_M_string_length = (size_type)local_a8;
    local_a8 = (string *)0x0;
    local_a0 = '\0';
    local_b0._M_p = &local_a0;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (local_a8 != (string *)0x0) {
      psVar5 = (string *)0x0;
      do {
        if (((byte)(local_b0._M_p[(long)psVar5] + 0xbfU) < 0x1a) && (psVar5 != (string *)0x0)) {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        psVar5 = psVar5 + 1;
      } while (psVar5 < local_a8);
    }
  }
  if (local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p,CONCAT71(uStack_9f,local_a0) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string UnCamelCaseFieldName(const string& name, const FieldDescriptor* field) {
  string worker(name);
  if (HasSuffixString(worker, "_p")) {
    worker = StripSuffixString(worker, "_p");
  }
  if (field->is_repeated() && HasSuffixString(worker, "Array")) {
    worker = StripSuffixString(worker, "Array");
  }
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    if (worker.length() > 0) {
      if (ascii_islower(worker[0])) {
        worker[0] = ascii_toupper(worker[0]);
      }
    }
    return worker;
  } else {
    string result;
    for (int i = 0; i < worker.size(); i++) {
      char c = worker[i];
      if (ascii_isupper(c)) {
        if (i > 0) {
          result += '_';
        }
        result += ascii_tolower(c);
      } else {
        result += c;
      }
    }
    return result;
  }
}